

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O3

ssize_t __thiscall vox::nTRN::write(nTRN *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  FILE *__n_00;
  FILE *__s;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  long lVar2;
  long lVar3;
  int32_t id;
  size_t childSize;
  size_t contentSize;
  undefined4 local_34;
  undefined8 local_30;
  size_t local_28;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  local_34 = 0x4e52546e;
  fwrite(&local_34,4,1,__s);
  local_28 = getSize(this);
  fwrite(&local_28,4,1,__s);
  local_30 = 0;
  fwrite(&local_30,4,1,__s);
  __n_00 = __s;
  fwrite(this,4,1,__s);
  DICT::write(&this->nodeAttribs,__fd,__buf_00,(size_t)__n_00);
  fwrite(&this->childNodeId,4,1,__s);
  fwrite(&this->reservedId,4,1,__s);
  fwrite(&this->layerId,4,1,__s);
  sVar1 = fwrite(&this->numFrames,4,1,__s);
  if (0 < this->numFrames) {
    lVar3 = 0;
    lVar2 = 0;
    __buf_01 = extraout_RDX;
    do {
      DICT::write((DICT *)((long)&((this->frames).
                                   super__Vector_base<vox::DICT,_std::allocator<vox::DICT>_>._M_impl
                                   .super__Vector_impl_data._M_start)->count + lVar3),__fd,__buf_01,
                  (size_t)__s);
      lVar2 = lVar2 + 1;
      sVar1 = (size_t)this->numFrames;
      lVar3 = lVar3 + 0x20;
      __buf_01 = extraout_RDX_00;
    } while (lVar2 < (long)sVar1);
  }
  return sVar1;
}

Assistant:

void nTRN::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('n', 'T', 'R', 'N');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&nodeId, sizeof(int32_t), 1, fp);
    nodeAttribs.write(fp);
    fwrite(&childNodeId, sizeof(int32_t), 1, fp);
    fwrite(&reservedId, sizeof(int32_t), 1, fp);
    fwrite(&layerId, sizeof(int32_t), 1, fp);
    fwrite(&numFrames, sizeof(int32_t), 1, fp);
    for (int i = 0; i < numFrames; i++)
        frames[i].write(fp);
}